

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorAngle.cpp
# Opt level: O2

void __thiscall chrono::ChShaftsMotorAngle::ChShaftsMotorAngle(ChShaftsMotorAngle *this)

{
  undefined1 auVar1 [64];
  __shared_ptr<chrono::ChFunction_Ramp,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  undefined8 local_28;
  double local_20;
  
  ChShaftsMotorBase::ChShaftsMotorBase(&this->super_ChShaftsMotorBase);
  (this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsMotorAngle_0116f318;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.c_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.l_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.b_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.cfm_i = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.broken = false;
  (this->f_rot).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->f_rot).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->rot_offset = 0.0;
  this->violation = 0.0;
  this->motor_torque = 0.0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.active = true;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.g_i = 0.0;
  (this->constraint).super_ChConstraintTwo.variables_a = (ChVariables *)SUB168(ZEXT416(0) << 0x40,0)
  ;
  (this->constraint).super_ChConstraintTwo.variables_b = (ChVariables *)SUB168(ZEXT416(0) << 0x40,8)
  ;
  auVar1 = ZEXT464(0) << 0x40;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoGeneric_01186d30;
  (this->constraint).Cq_a = (ChRowVectorDynamic<double>)auVar1._0_16_;
  (this->constraint).Cq_b = (ChRowVectorDynamic<double>)auVar1._16_16_;
  (this->constraint).Eq_a = (ChVectorDynamic<double>)auVar1._32_16_;
  (this->constraint).Eq_b = (ChVectorDynamic<double>)auVar1._48_16_;
  local_20 = 0.0;
  local_28 = 0x3ff0000000000000;
  std::make_shared<chrono::ChFunction_Ramp,double,double>((double *)&_Stack_38,&local_20);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->f_rot,&_Stack_38)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  return;
}

Assistant:

ChShaftsMotorAngle::ChShaftsMotorAngle() : rot_offset(0), violation(0), motor_torque(0) {
    // default motion function : a ramp
    this->f_rot = chrono_types::make_shared<ChFunction_Ramp>(
        0.0,   // default y(0)
        1.0    // default dy/dx , i.e.   1 [rad/s]
        );
    
}